

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::OutputFile::setFrameBuffer(OutputFile *this,FrameBuffer *frameBuffer)

{
  PixelType PVar1;
  size_t xs;
  size_t ys;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  ArgExc *pAVar5;
  Channel *pCVar6;
  Slice *pSVar7;
  vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
  *in_RSI;
  ConstIterator j_1;
  ConstIterator i_1;
  vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
  slices;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  ConstIterator j;
  ConstIterator i;
  ChannelList *channels;
  Lock lock;
  int in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa2c;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  int iVar8;
  Slice *in_stack_fffffffffffffa40;
  const_iterator in_stack_fffffffffffffac8;
  vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
  *in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffb30;
  int in_stack_fffffffffffffb34;
  Slice *in_stack_fffffffffffffb38;
  OutSliceInfo local_400;
  OutSliceInfo local_3d0;
  const_iterator local_3a0;
  const_iterator local_398;
  const_iterator local_390;
  const_iterator local_388;
  stringstream local_368 [16];
  ostream local_358 [376];
  stringstream local_1e0 [16];
  ostream local_1d0 [376];
  const_iterator local_58;
  const_iterator local_50;
  const_iterator local_48;
  const_iterator local_40;
  ChannelList *local_28;
  vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
  *local_10;
  
  local_10 = in_RSI;
  IlmThread_2_5::Lock::Lock
            ((Lock *)in_stack_fffffffffffffa40,
             (Mutex *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
             SUB41((uint)in_stack_fffffffffffffa34 >> 0x18,0));
  local_28 = Header::channels((Header *)0x23c9f5);
  local_40._M_node =
       (_Base_ptr)
       ChannelList::begin((ChannelList *)
                          CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  do {
    local_48._M_node =
         (_Base_ptr)
         ChannelList::end((ChannelList *)
                          CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
    bVar2 = Imf_2_5::operator!=((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
    if (!bVar2) {
      std::
      vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
      ::vector((vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                *)0x23cef2);
      local_388._M_node =
           (_Base_ptr)
           ChannelList::begin((ChannelList *)
                              CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
      while( true ) {
        local_390._M_node =
             (_Base_ptr)
             ChannelList::end((ChannelList *)
                              CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        bVar2 = Imf_2_5::operator!=((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        if (!bVar2) break;
        in_stack_fffffffffffffad0 = local_10;
        ChannelList::ConstIterator::name((ConstIterator *)0x23cf8b);
        in_stack_fffffffffffffac8._M_node =
             (_Base_ptr)
             FrameBuffer::find((FrameBuffer *)in_stack_fffffffffffffb38,
                               (char *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30)
                              );
        local_398._M_node = in_stack_fffffffffffffac8._M_node;
        local_3a0._M_node =
             (_Base_ptr)
             FrameBuffer::end((FrameBuffer *)
                              CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        bVar2 = Imf_2_5::operator==((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        if (bVar2) {
          pCVar6 = ChannelList::ConstIterator::channel((ConstIterator *)0x23d026);
          PVar1 = pCVar6->type;
          pCVar6 = ChannelList::ConstIterator::channel((ConstIterator *)0x23d04b);
          iVar8 = pCVar6->xSampling;
          pCVar6 = ChannelList::ConstIterator::channel((ConstIterator *)0x23d071);
          in_stack_fffffffffffffa28 = pCVar6->ySampling;
          in_stack_fffffffffffffa30 = 1;
          anon_unknown_6::OutSliceInfo::OutSliceInfo
                    (&local_3d0,PVar1,(char *)0x0,0,0,iVar8,in_stack_fffffffffffffa28,true);
          std::
          vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
          ::push_back((vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                       *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                      (value_type *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        }
        else {
          pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x23d0fe);
          PVar1 = pSVar7->type;
          pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x23d11d);
          pcVar4 = pSVar7->base;
          pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x23d13f);
          xs = pSVar7->xStride;
          pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x23d161);
          ys = pSVar7->yStride;
          pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x23d183);
          iVar8 = pSVar7->xSampling;
          in_stack_fffffffffffffa40 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x23d1a3);
          in_stack_fffffffffffffa28 = in_stack_fffffffffffffa40->ySampling;
          in_stack_fffffffffffffa30 = 0;
          anon_unknown_6::OutSliceInfo::OutSliceInfo
                    (&local_400,PVar1,pcVar4,xs,ys,iVar8,in_stack_fffffffffffffa28,false);
          std::
          vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
          ::push_back((vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                       *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                      (value_type *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        }
        ChannelList::ConstIterator::operator++
                  ((ConstIterator *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
      }
      FrameBuffer::operator=
                ((FrameBuffer *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                 (FrameBuffer *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
      std::
      vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
      ::operator=(in_stack_fffffffffffffad0,
                  (vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                   *)in_stack_fffffffffffffac8._M_node);
      std::
      vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
      ::~vector((vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                 *)in_stack_fffffffffffffa40);
      IlmThread_2_5::Lock::~Lock
                ((Lock *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
      return;
    }
    ChannelList::ConstIterator::name((ConstIterator *)0x23caa8);
    local_50._M_node =
         (_Base_ptr)
         FrameBuffer::find((FrameBuffer *)in_stack_fffffffffffffb38,
                           (char *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
    local_58._M_node =
         (_Base_ptr)
         FrameBuffer::end((FrameBuffer *)
                          CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
    bVar2 = Imf_2_5::operator==((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
    if (!bVar2) {
      pCVar6 = ChannelList::ConstIterator::channel((ConstIterator *)0x23cb5e);
      PVar1 = pCVar6->type;
      pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x23cb86);
      if (PVar1 != pSVar7->type) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1e0);
        poVar3 = std::operator<<(local_1d0,"Pixel type of \"");
        pcVar4 = ChannelList::ConstIterator::name((ConstIterator *)0x23cbea);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"\" channel of output file \"");
        pcVar4 = fileName((OutputFile *)0x23cc3e);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::operator<<(poVar3,"\" is not compatible with the frame buffer\'s pixel type.");
        pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar5,local_1e0);
        __cxa_throw(pAVar5,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      pCVar6 = ChannelList::ConstIterator::channel((ConstIterator *)0x23ccf2);
      iVar8 = pCVar6->xSampling;
      pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x23cd1b);
      if (iVar8 != pSVar7->xSampling) {
LAB_0023cd91:
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_368);
        poVar3 = std::operator<<(local_358,"X and/or y subsampling factors of \"");
        pcVar4 = ChannelList::ConstIterator::name((ConstIterator *)0x23cdd4);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"\" channel of output file \"");
        pcVar4 = fileName((OutputFile *)0x23ce28);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::operator<<(poVar3,"\" are not compatible with the frame buffer\'s subsampling factors."
                       );
        pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar5,local_368);
        __cxa_throw(pAVar5,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      pCVar6 = ChannelList::ConstIterator::channel((ConstIterator *)0x23cd46);
      in_stack_fffffffffffffb34 = pCVar6->ySampling;
      in_stack_fffffffffffffb38 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x23cd6f);
      if (in_stack_fffffffffffffb34 != in_stack_fffffffffffffb38->ySampling) goto LAB_0023cd91;
    }
    ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
  } while( true );
}

Assistant:

void	
OutputFile::setFrameBuffer (const FrameBuffer &frameBuffer)
{
    Lock lock (*_data->_streamData);
    
    //
    // Check if the new frame buffer descriptor
    // is compatible with the image file header.
    //

    const ChannelList &channels = _data->header.channels();

    for (ChannelList::ConstIterator i = channels.begin();
	 i != channels.end();
	 ++i)
    {
	FrameBuffer::ConstIterator j = frameBuffer.find (i.name());

	if (j == frameBuffer.end())
	    continue;

	if (i.channel().type != j.slice().type)
	{
	    THROW (IEX_NAMESPACE::ArgExc, "Pixel type of \"" << i.name() << "\" channel "
			        "of output file \"" << fileName() << "\" is "
			        "not compatible with the frame buffer's "
			        "pixel type.");
	}

	if (i.channel().xSampling != j.slice().xSampling ||
	    i.channel().ySampling != j.slice().ySampling)
	{
	    THROW (IEX_NAMESPACE::ArgExc, "X and/or y subsampling factors "
				"of \"" << i.name() << "\" channel "
				"of output file \"" << fileName() << "\" are "
				"not compatible with the frame buffer's "
				"subsampling factors.");
	}
    }
    
    //
    // Initialize slice table for writePixels().
    //

    vector<OutSliceInfo> slices;

    for (ChannelList::ConstIterator i = channels.begin();
	 i != channels.end();
	 ++i)
    {
	FrameBuffer::ConstIterator j = frameBuffer.find (i.name());

	if (j == frameBuffer.end())
	{
	    //
	    // Channel i is not present in the frame buffer.
	    // In the file, channel i will contain only zeroes.
	    //

	    slices.push_back (OutSliceInfo (i.channel().type,
					    0, // base
					    0, // xStride,
					    0, // yStride,
					    i.channel().xSampling,
					    i.channel().ySampling,
					    true)); // zero
	}
	else
	{
	    //
	    // Channel i is present in the frame buffer.
	    //

	    slices.push_back (OutSliceInfo (j.slice().type,
					    j.slice().base,
					    j.slice().xStride,
					    j.slice().yStride,
					    j.slice().xSampling,
					    j.slice().ySampling,
					    false)); // zero
	}
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;
    _data->slices = slices;
}